

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O0

void Qentem::Test::TestRawVariableTag2(QTest *test)

{
  StringStream<char> *pSVar1;
  char *content;
  Value<char> value;
  StringStream<char> ss;
  QTest *test_local;
  
  StringStream<char>::StringStream((StringStream<char> *)&value.type_);
  JSON::Parse<char>((Value<char> *)&content,"[\"A\", \"abc\", true, 456, 1.5]");
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0}{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,pSVar1,(char (*) [3])0x131146,0x4e0);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1}{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,pSVar1,(char (*) [5])"abcA",0x4e4);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1}{raw:2}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar1,(char (*) [8])"abctrue",0x4e8);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:2}{raw:3}{raw:2}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar1,(char (*) [12])"true456true",0x4ec);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:4}{raw:4}{raw:4}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>(test,pSVar1,(char (*) [10])"1.51.51.5",0x4f0);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0}-{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,pSVar1,(char (*) [4])"A-A",0x4f6);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1}--{raw:0}",(Value<char> *)&content,(StringStream<char> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar1,(char (*) [7])"abc--A",0x4fa);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1}---{raw:2}",(Value<char> *)&content,(StringStream<char> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar1,(char (*) [11])"abc---true",0x4fe)
  ;
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:2}{raw:3}--{raw:2}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar1,(char (*) [14])"true456--true",0x502);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:4}--{raw:4}{raw:4}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar1,(char (*) [12])"1.5--1.51.5",0x506);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:4}--{raw:4}--{raw:4}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar1,(char (*) [14])"1.5--1.5--1.5",0x50a);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:4}---{raw:4}---{raw:4}",(Value<char> *)&content,
                      (StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,pSVar1,(char (*) [16])"1.5---1.5---1.5",0x50e);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::~Value((Value<char> *)&content);
  StringStream<char>::~StringStream((StringStream<char> *)&value.type_);
  return;
}

Assistant:

static void TestRawVariableTag2(QTest &test) {
    StringStream<char> ss;
    const Value<char>  value = JSON::Parse(R"(["A", "abc", true, 456, 1.5])");
    const char        *content;

    content = R"({raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(AA)", __LINE__);
    ss.Clear();

    content = R"({raw:1}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(abcA)", __LINE__);
    ss.Clear();

    content = R"({raw:1}{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(abctrue)", __LINE__);
    ss.Clear();

    content = R"({raw:2}{raw:3}{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(true456true)", __LINE__);
    ss.Clear();

    content = R"({raw:4}{raw:4}{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.51.51.5)", __LINE__);
    ss.Clear();

    ///

    content = R"({raw:0}-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(A-A)", __LINE__);
    ss.Clear();

    content = R"({raw:1}--{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(abc--A)", __LINE__);
    ss.Clear();

    content = R"({raw:1}---{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(abc---true)", __LINE__);
    ss.Clear();

    content = R"({raw:2}{raw:3}--{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(true456--true)", __LINE__);
    ss.Clear();

    content = R"({raw:4}--{raw:4}{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.5--1.51.5)", __LINE__);
    ss.Clear();

    content = R"({raw:4}--{raw:4}--{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.5--1.5--1.5)", __LINE__);
    ss.Clear();

    content = R"({raw:4}---{raw:4}---{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.5---1.5---1.5)", __LINE__);
    ss.Clear();
}